

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::RenditionAdapterBlendsAllowedPixelRegionsWithNoLimitations
          (RendererTests *this)

{
  agge_vector<int> offset;
  allocator local_271;
  string local_270 [32];
  LocationInfo local_250;
  allocator local_221;
  string local_220 [32];
  LocationInfo local_200;
  uchar auStack_1d8 [8];
  uint8_t reference2 [20];
  int local_1b8 [2];
  int reference1 [35];
  zero local_121;
  agge_vector<int> local_120;
  undefined1 local_118 [8];
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  r2;
  bitmap<unsigned_char,_0UL,_0UL> bitmap2;
  blender<unsigned_char,_unsigned_char> blender2;
  uint8_t covers2 [3];
  undefined1 local_98 [8];
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_> r1;
  undefined1 local_50 [8];
  bitmap<int,_0UL,_0UL> bitmap1;
  blender<int,_short> blender1;
  short covers1 [4];
  RendererTests *this_local;
  
  blender1.filling_log.
  super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xe2400300021001;
  tests::mocks::blender<int,_short>::blender((blender<int,_short> *)&bitmap1._width);
  tests::mocks::bitmap<int,_0UL,_0UL>::bitmap((bitmap<int,_0UL,_0UL> *)local_50,7,5);
  offset = zero::operator_cast_to_agge_vector
                     ((zero *)((long)&blender2.filling_log.
                                      super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  adapter((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>
           *)local_98,(bitmap<int,_0UL,_0UL> *)local_50,offset,(rect_i *)0x0,
          (blender<int,_short> *)&bitmap1._width);
  blender2.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0x91;
  blender2.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_2_ = 0x8ed;
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender
            ((blender<unsigned_char,_unsigned_char> *)&bitmap2._width);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)&r2._y,5,4);
  local_120 = zero::operator_cast_to_agge_vector(&local_121);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::adapter((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
             *)local_118,(bitmap<unsigned_char,_0UL,_0UL> *)&r2._y,local_120,(rect_i *)0x0,
            (blender<unsigned_char,_unsigned_char> *)&bitmap2._width);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  set_y((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>
         *)local_98,0);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  operator()((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>
              *)local_98,0,3,
             (cover_type *)
             &blender1.filling_log.
              super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  set_y((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>
         *)local_98,1);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  operator()((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>
              *)local_98,0,2,
             (cover_type *)
             &blender1.filling_log.
              super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  set_y((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>
         *)local_98,4);
  renderer::
  adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>::
  operator()((adapter<agge::tests::mocks::bitmap<int,_0UL,_0UL>,_agge::tests::mocks::blender<int,_short>_>
              *)local_98,3,4,
             (cover_type *)
             &blender1.filling_log.
              super__Vector_base<agge::tests::mocks::blender<int,_short>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<int,_short>::fill_log_entry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
           *)local_118,2);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                *)local_118,4,1,
               (cover_type *)
               ((long)&blender2.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                *)local_118,1,3,
               (cover_type *)
               ((long)&blender2.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::set_y((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
           *)local_118,3);
  renderer::
  adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
  ::operator()((adapter<agge::tests::mocks::bitmap<unsigned_char,_0UL,_0UL>,_agge::tests::mocks::blender<unsigned_char,_unsigned_char>_>
                *)local_118,2,3,
               (cover_type *)
               ((long)&blender2.filling_log.
                       super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  memcpy(local_1b8,&DAT_0029f4d0,0x8c);
  auStack_1d8[0] = '\0';
  auStack_1d8[1] = '\0';
  auStack_1d8[2] = '\0';
  auStack_1d8[3] = '\0';
  auStack_1d8[4] = '\0';
  auStack_1d8[5] = '\0';
  auStack_1d8[6] = '\0';
  auStack_1d8[7] = '\0';
  reference2[0] = '\0';
  reference2[1] = '\0';
  reference2[2] = '\0';
  reference2[3] = 0xed;
  reference2[4] = '\b';
  reference2[5] = 0x91;
  reference2[6] = 0xed;
  reference2[7] = '\0';
  reference2[8] = '\0';
  reference2[9] = 0xed;
  reference2[10] = '\b';
  reference2[0xb] = 0x91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_221);
  ut::LocationInfo::LocationInfo(&local_200,(string *)local_220,0x290);
  ut::are_equal<int,35ul,std::vector<int,std::allocator<int>>>
            ((int (*) [35])local_1b8,(vector<int,_std::allocator<int>_> *)local_50,&local_200);
  ut::LocationInfo::~LocationInfo(&local_200);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_270,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_271);
  ut::LocationInfo::LocationInfo(&local_250,(string *)local_270,0x291);
  ut::are_equal<unsigned_char,20ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [20])auStack_1d8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&r2._y,&local_250);
  ut::LocationInfo::~LocationInfo(&local_250);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::~bitmap((bitmap<unsigned_char,_0UL,_0UL> *)&r2._y);
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender
            ((blender<unsigned_char,_unsigned_char> *)&bitmap2._width);
  tests::mocks::bitmap<int,_0UL,_0UL>::~bitmap((bitmap<int,_0UL,_0UL> *)local_50);
  tests::mocks::blender<int,_short>::~blender((blender<int,_short> *)&bitmap1._width);
  return;
}

Assistant:

test( RenditionAdapterBlendsAllowedPixelRegionsWithNoLimitations )
			{
				// INIT
				short covers1[] = { 0x1001, 0x0002, 0x4003, 0x00E2, };
				mocks::blender<int, short> blender1;
				mocks::bitmap<int> bitmap1(7, 5);
				renderer::adapter< mocks::bitmap<int>, mocks::blender<int, short> > r1(bitmap1, zero(), 0, blender1);

				uint8_t covers2[] = { 0xED, 0x08, 0x91, };
				mocks::blender<uint8_t, uint8_t> blender2;
				mocks::bitmap<uint8_t> bitmap2(5, 4);
				renderer::adapter< mocks::bitmap<uint8_t>, mocks::blender<uint8_t, uint8_t> > r2(bitmap2, zero(), 0, blender2);

				// ACT
				r1.set_y(0);
				r1(0, 3, covers1);
				
				r1.set_y(1);
				r1(0, 2, covers1);
				
				r1.set_y(4);
				r1(3, 4, covers1);

				r2.set_y(2);
				r2(4, 1, covers2);
				r2(1, 3, covers2);
				
				r2.set_y(3);
				r2(2, 3, covers2);

				// ASSERT
				int reference1[] = {
					0x00001001, 0x00000002, 0x00004003, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x01001001, 0x01000002, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000, 0x00000000,
					0x00000000, 0x00000000, 0x00000000, 0x04031001, 0x04030002, 0x04034003, 0x040300E2,
				};
				uint8_t reference2[] = {
					0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0xED, 0x08, 0x91, 0xED,
					0x00, 0x00, 0xED, 0x08, 0x91,
				};

				assert_equal(reference1, bitmap1.data);
				assert_equal(reference2, bitmap2.data);
			}